

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

char * mpack_read_bytes_inplace_notrack(mpack_reader_t *reader,size_t count)

{
  _Bool _Var1;
  mpack_error_t mVar2;
  char *bytes;
  char *bytes_1;
  size_t count_local;
  mpack_reader_t *reader_local;
  
  mVar2 = mpack_reader_error(reader);
  if (mVar2 == mpack_ok) {
    if ((ulong)((long)reader->end - (long)reader->data) < count) {
      _Var1 = mpack_reader_ensure(reader,count);
      if (_Var1) {
        reader_local = (mpack_reader_t *)reader->data;
        reader->data = reader->data + count;
      }
      else {
        reader_local = (mpack_reader_t *)0x0;
      }
    }
    else {
      reader_local = (mpack_reader_t *)reader->data;
      reader->data = reader->data + count;
    }
  }
  else {
    reader_local = (mpack_reader_t *)0x0;
  }
  return (char *)reader_local;
}

Assistant:

static const char* mpack_read_bytes_inplace_notrack(mpack_reader_t* reader, size_t count) {
    if (mpack_reader_error(reader) != mpack_ok)
        return NULL;

    // if we have enough bytes already in the buffer, we can return it directly.
    if ((size_t)(reader->end - reader->data) >= count) {
        const char* bytes = reader->data;
        reader->data += count;
        return bytes;
    }

    if (!mpack_reader_ensure(reader, count))
        return NULL;

    const char* bytes = reader->data;
    reader->data += count;
    return bytes;
}